

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall
bidirectional::BiDirectional::updateCurrentLabel(BiDirectional *this,Directions *direction)

{
  Search *pSVar1;
  pointer pvVar2;
  size_type sVar3;
  Label *new_label;
  Search *search_ptr;
  undefined4 in_stack_ffffffffffffff50;
  Directions in_stack_ffffffffffffff54;
  BiDirectional *in_stack_ffffffffffffff58;
  Search *in_stack_ffffffffffffff60;
  Directions *in_stack_ffffffffffffff80;
  vector<labelling::Label,_std::allocator<labelling::Label>_> *in_stack_ffffffffffffff88;
  
  pSVar1 = getSearchPtr(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  pvVar2 = std::
           unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           ::operator->((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                         *)0x2465fa);
  sVar3 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::size(pvVar2);
  if (sVar3 == 0) {
    pSVar1->stop = true;
  }
  else {
    std::
    unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
    ::get((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    labelling::getNextLabel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Search::replaceCurrentLabel(in_stack_ffffffffffffff60,(Label *)in_stack_ffffffffffffff58);
    pvVar2 = std::
             unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
             ::operator->((unique_ptr<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                           *)0x246670);
    sVar3 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::size(pvVar2);
    pSVar1->unprocessed_count = (int)sVar3;
    labelling::Label::~Label((Label *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
  }
  return;
}

Assistant:

void BiDirectional::updateCurrentLabel(const Directions& direction) {
  Search* search_ptr = getSearchPtr(direction);
  if (search_ptr->unprocessed_labels->size() > 0) {
    // Get next label and removes current_label from heap
    const labelling::Label& new_label = labelling::getNextLabel(
        search_ptr->unprocessed_labels.get(), direction);
    // swap current label with new label
    search_ptr->replaceCurrentLabel(new_label);
    // Update unprocessed label counter
    search_ptr->unprocessed_count = search_ptr->unprocessed_labels->size();
    SPDLOG_DEBUG("{} left in {}", search_ptr->unprocessed_count, direction);
  } else {
    search_ptr->stop = true;
  }
}